

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zap.c
# Opt level: O3

void do_osshock(obj *obj)

{
  boolean bVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  
  obj_zapped = 1;
  if (poly_zapped < 0) {
    for (lVar6 = (long)obj->quan; lVar6 != 0; lVar6 = lVar6 + -1) {
      lVar3 = (long)u.uluck;
      lVar4 = (long)u.moreluck;
      uVar2 = mt_random();
      if (SUB168(ZEXT416(uVar2) % SEXT816(lVar3 + lVar4 + 0x2d),0) == 0) {
        poly_zapped = *(ushort *)&objects[obj->otyp].field_0x11 >> 4 & 0x1f;
        break;
      }
    }
  }
  uVar2 = obj->quan;
  if (1 < (int)uVar2) {
    uVar5 = 30000;
    if (uVar2 < 0x8000) {
      uVar5 = (ulong)(uVar2 - 1);
    }
    uVar2 = mt_random();
    obj = splitobj(obj,(ulong)((int)((ulong)uVar2 % uVar5) + 1));
  }
  bVar1 = costly_spot(obj->ox,obj->oy);
  if (bVar1 != '\0') {
    if (u.ushops[0] == '\0') {
      stolen_value(obj,obj->ox,obj->oy,'\0','\0');
    }
    else {
      addtobill(obj,'\0','\0','\0');
    }
  }
  delobj(obj);
  return;
}

Assistant:

void do_osshock(struct obj *obj)
{
	long i;

	obj_zapped = TRUE;

	if (poly_zapped < 0) {
	    /* some may metamorphosize */
	    for (i = obj->quan; i; i--)
		if (! rn2(Luck + 45)) {
		    poly_zapped = objects[obj->otyp].oc_material;
		    break;
		}
	}

	/* if quan > 1 then some will survive intact */
	if (obj->quan > 1L) {
	    if (obj->quan > LARGEST_INT)
		obj = splitobj(obj, (long)rnd(30000));
	    else
		obj = splitobj(obj, (long)rnd((int)obj->quan - 1));
	}

	/* appropriately add damage to bill */
	if (costly_spot(obj->ox, obj->oy)) {
		if (*u.ushops)
			addtobill(obj, FALSE, FALSE, FALSE);
		else
			stolen_value(obj,
					   obj->ox, obj->oy, FALSE, FALSE);
	}

	/* zap the object */
	delobj(obj);
}